

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_test.cc
# Opt level: O0

void __thiscall fizplex::VerificationTest_Blend_Test::TestBody(VerificationTest_Blend_Test *this)

{
  bool bVar1;
  LP *this_00;
  char *message;
  char *in_R9;
  Simplex *unaff_retaddr;
  AssertionResult gtest_ar_;
  Simplex spx;
  LP lp;
  string *in_stack_00000488;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  string local_190;
  AssertHelper in_stack_fffffffffffffe90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  AssertionResult local_158 [3];
  int in_stack_fffffffffffffee4;
  LP *in_stack_fffffffffffffee8;
  Simplex *in_stack_fffffffffffffef0;
  allocator<char> local_b1;
  string local_b0 [176];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (char *)in_stack_fffffffffffffe98.ptr_,
             (allocator<char> *)in_stack_fffffffffffffe90.data_);
  MPSReader::read_lp(in_stack_00000488);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Simplex::Simplex(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  Simplex::solve(unaff_retaddr);
  this_00 = (LP *)Simplex::get_z((Simplex *)(local_158 + 1));
  bVar1 = is_eq_norm(-30.812149846,
                     (double)(this_00->A).cols.
                             super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>
                             ._M_impl.super__Vector_impl_data._M_start,1e-06,1e-07);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)),
             (type *)0x1ddb09);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_158,
               (AssertionResult *)"is_eq_norm(-3.0812149846E+01, spx.get_z())","false","true",in_R9)
    ;
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/verification_test.cc"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message((Message *)0x1ddc4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ddcb8);
  Simplex::~Simplex((Simplex *)this_00);
  LP::~LP(this_00);
  return;
}

Assistant:

TEST(VerificationTest, Blend) {
  LP lp = MPSReader::read_lp("./test/blend.mps");

  Simplex spx(lp);
  spx.solve();
  EXPECT_TRUE(is_eq_norm(-3.0812149846E+01, spx.get_z()));
}